

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O0

void dec_update_map(com_core_t *core)

{
  ushort uVar1;
  int scup_00;
  int i_scu_00;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  s16 (*pasVar6) [2];
  bool bVar7;
  bool local_99;
  uavs3d_union128_t mv_128_1;
  u16 scu_16;
  u32 refi_32;
  uavs3d_union128_t mv_128;
  u32 scu_32;
  u64 refi_64;
  u16 refi;
  s16 (*mv) [2];
  com_scu_t scu;
  com_scu_t *pcStack_48;
  u32 cu_pos;
  com_scu_t *map_scu;
  u32 *map_pos;
  s16 (*map_mv) [2] [2];
  s8 (*map_refi) [2];
  int h_cu;
  int w_cu;
  int i_scu;
  int scup;
  int j;
  int i;
  com_core_t *core_local;
  
  scup_00 = core->cu_scup;
  i_scu_00 = core->seqhdr->i_scu;
  uVar4 = 1 << ((char)core->cu_log2w - 2U & 0x1f);
  iVar5 = 1 << ((char)core->cu_log2h - 2U & 0x1f);
  map_mv = (s16 (*) [2] [2])((core->map).map_refi + scup_00);
  map_pos = (u32 *)((core->map).map_mv + scup_00);
  map_scu = (com_scu_t *)((core->map).map_pos + scup_00);
  pcStack_48 = (core->map).map_scu + scup_00;
  mv._4_4_ = 0;
  memset((void *)((long)&mv + 3),0,1);
  pasVar6 = core->mv;
  uVar1 = *(ushort *)core->refi;
  bVar7 = core->cu_mode == 0;
  local_99 = true;
  if ((*(int *)core->cbfy == 0) && (local_99 = true, *(short *)core->cbfc == 0)) {
    local_99 = bVar7;
  }
  mv._3_1_ = (com_scu_t)
             ((byte)mv._3_1_ & 0x80 | 1 | bVar7 << 1 | !bVar7 << 2 | (core->affine_flag & 3) << 5 |
              (core->cu_mode == 2) << 3 | local_99 << 4);
  mv._4_4_ = core->cu_log2w & 7U | (core->cu_log2h & 7U) << 3 | core->cu_scup << 6;
  if (core->affine_flag == '\0') {
    if ((uVar4 & 3) == 0) {
      uVar2 = *(undefined8 *)pasVar6;
      uVar3 = *(undefined8 *)pasVar6;
      for (scup = 0; scup < iVar5; scup = scup + 1) {
        for (i_scu = 0; i_scu < (int)uVar4; i_scu = i_scu + 4) {
          *(uint *)(pcStack_48 + i_scu) = (uint)(byte)mv._3_1_ * 0x1010101;
          *(ulong *)((*map_mv)[0] + i_scu) = (ulong)uVar1 * 0x1000100010001;
          *(undefined8 *)(map_pos + (long)i_scu * 2) = uVar2;
          *(undefined8 *)(map_pos + (long)i_scu * 2 + 2) = uVar3;
          *(undefined8 *)(map_pos + (long)i_scu * 2 + 4) = uVar2;
          *(undefined8 *)(map_pos + (long)i_scu * 2 + 6) = uVar3;
        }
        *(uint *)(map_scu + (long)(int)(uVar4 - 1) * 4) = mv._4_4_;
        map_mv = (s16 (*) [2] [2])((*map_mv)[0] + i_scu_00);
        map_pos = map_pos + (long)i_scu_00 * 2;
        map_scu = map_scu + (long)i_scu_00 * 4;
        pcStack_48 = pcStack_48 + i_scu_00;
      }
    }
    else if ((uVar4 & 1) == 0) {
      uVar2 = *(undefined8 *)pasVar6;
      uVar3 = *(undefined8 *)pasVar6;
      for (scup = 0; scup < iVar5; scup = scup + 1) {
        *(ushort *)pcStack_48 = (ushort)(byte)mv._3_1_ * 0x101;
        (*map_mv)[0] = (s16  [2])((uint)uVar1 * 0x10001);
        *(undefined8 *)map_pos = uVar2;
        *(undefined8 *)(map_pos + 2) = uVar3;
        *(uint *)(map_scu + (long)(int)(uVar4 - 1) * 4) = mv._4_4_;
        map_mv = (s16 (*) [2] [2])((*map_mv)[0] + i_scu_00);
        map_pos = map_pos + (long)i_scu_00 * 2;
        map_scu = map_scu + (long)i_scu_00 * 4;
        pcStack_48 = pcStack_48 + i_scu_00;
      }
    }
    else {
      for (scup = 0; scup < iVar5; scup = scup + 1) {
        *pcStack_48 = mv._3_1_;
        (*map_mv)[0][0] = uVar1;
        *(undefined8 *)map_pos = *(undefined8 *)pasVar6;
        *(uint *)map_scu = mv._4_4_;
        map_mv = (s16 (*) [2] [2])((*map_mv)[0] + i_scu_00);
        map_pos = map_pos + (long)i_scu_00 * 2;
        map_scu = map_scu + (long)i_scu_00 * 4;
        pcStack_48 = pcStack_48 + i_scu_00;
      }
    }
  }
  else {
    for (scup = 0; scup < iVar5; scup = scup + 1) {
      memset(pcStack_48,(uint)(byte)mv._3_1_,(long)(int)uVar4);
      for (i_scu = 0; i_scu < (int)uVar4; i_scu = i_scu + 1) {
        (*map_mv)[0][i_scu] = uVar1;
      }
      *(uint *)(map_scu + (long)(int)(uVar4 - 1) * 4) = mv._4_4_;
      map_mv = (s16 (*) [2] [2])((*map_mv)[0] + i_scu_00);
      map_scu = map_scu + (long)i_scu_00 * 4;
      pcStack_48 = pcStack_48 + i_scu_00;
    }
    set_affine_mvf(core,scup_00,core->cu_log2w,core->cu_log2h,i_scu_00,&core->map,core->pichdr);
  }
  for (i_scu = 0; i_scu < (int)uVar4; i_scu = i_scu + 1) {
    *(uint *)(map_scu + (long)i_scu * 4 + (long)i_scu_00 * -4) = mv._4_4_;
  }
  return;
}

Assistant:

void dec_update_map(com_core_t * core)
{
    int i, j;
    int scup  = core->cu_scup;
    int i_scu = core->seqhdr->i_scu;
    int w_cu = 1 << (core->cu_log2w - MIN_CU_LOG2);
    int h_cu = 1 << (core->cu_log2h - MIN_CU_LOG2);
    s8  (*map_refi)[REFP_NUM]       = core->map.map_refi + scup;
    s16 (*map_mv)  [REFP_NUM][MV_D] = core->map.map_mv   + scup;
    u32  *map_pos                   = core->map.map_pos  + scup;
    com_scu_t *map_scu              = core->map.map_scu  + scup;
    u32 cu_pos = 0;
    com_scu_t scu = { 0 };
    s16 (*mv)[MV_D] = core->mv;
    u16 refi = M16(core->refi);
    
    scu.coded  = 1;
    scu.intra  = core->cu_mode == MODE_INTRA;
    scu.inter  = !scu.intra;
    scu.affine = core->affine_flag;
    scu.skip   = core->cu_mode == MODE_SKIP;
    scu.cbf = M32(core->cbfy) || M16(core->cbfc) || scu.intra; // only used for deblock

    MCU_SET_LOGW(cu_pos, core->cu_log2w);
    MCU_SET_LOGH(cu_pos, core->cu_log2h);
    MCU_SET_SCUP(cu_pos, core->cu_scup);

    if (core->affine_flag) {
        for (i = 0; i < h_cu; i++) {
            memset(map_scu, *(u8*)&scu, w_cu);
            for (j = 0; j < w_cu; j++) {
                M16(map_refi[j]) = refi;
            }
            map_pos[w_cu - 1] = cu_pos;
            map_refi += i_scu;
            map_mv   += i_scu;
            map_pos  += i_scu;
            map_scu  += i_scu;
        }
        set_affine_mvf(core, scup, core->cu_log2w, core->cu_log2h, i_scu, &core->map, core->pichdr);
    } else {
        if ((w_cu & 3) == 0) {
            u64 refi_64 = refi * 0x0001000100010001;
            u32 scu_32 = (*(u8*)&scu) * 0x01010101;
            uavs3d_union128_t mv_128 = { M64(mv), M64(mv) };

            for (i = 0; i < h_cu; i++) {
                for (j = 0; j < w_cu; j += 4) {
                    M32(map_scu + j) = scu_32;
                    M64(map_refi + j) = refi_64;
                    CP128(map_mv + j, &mv_128);
                    CP128(map_mv + j + 2, &mv_128);
                }
                map_pos[w_cu - 1] = cu_pos;
                map_refi += i_scu;
                map_mv   += i_scu;
                map_pos  += i_scu;
                map_scu  += i_scu;
            }
        } else if ((w_cu & 1) == 0) {
            u32 refi_32 = refi * 0x00010001;
            u16 scu_16 = (*(u8*)&scu) * 0x0101;
            uavs3d_union128_t mv_128 = { M64(mv), M64(mv) };

            for (i = 0; i < h_cu; i++) {
                M16(map_scu) = scu_16;
                M32(map_refi) = refi_32;
                CP128(map_mv, &mv_128);
                map_pos[w_cu - 1] = cu_pos;
                map_refi += i_scu;
                map_mv   += i_scu;
                map_pos  += i_scu;
                map_scu  += i_scu;
            }
        } else {
            for (i = 0; i < h_cu; i++) {
                *map_scu = scu;
                M16(map_refi) = refi;
                CP64(map_mv, mv);
                map_pos[0] = cu_pos;
                map_refi += i_scu;
                map_mv   += i_scu;
                map_pos  += i_scu;
                map_scu  += i_scu;
            }
        }
    }

    map_pos -= i_scu;

    for (j = 0; j < w_cu; j++) {
        map_pos[j] = cu_pos;
    }
}